

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverVector.h
# Opt level: O3

void Eigen::internal::triangular_solve_vector<float,_float,_long,_1,_2,_false,_0>::run
               (long size,float *_lhs,long lhsStride,float *rhs)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float *pfVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong cols;
  ulong rows;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  ulong uVar20;
  ulong uVar21;
  float *pfVar22;
  Index size_1;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  float fVar26;
  undefined1 local_78 [16];
  undefined4 uStack_68;
  long local_60;
  float *local_58;
  long local_50;
  ulong local_48;
  const_blas_data_mapper<float,_long,_0> local_40;
  
  pfVar13 = (float *)CONCAT44(uStack_68,local_78._12_4_);
  if (size < 0 && _lhs != (float *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
                 );
  }
  if (0 < size) {
    local_58 = _lhs + (size + -1) * lhsStride + size;
    local_60 = ~lhsStride << 5;
    pfVar22 = rhs + size;
    uVar18 = size;
    do {
      cols = 8;
      if (uVar18 < 8) {
        cols = uVar18;
      }
      local_50 = -cols;
      uVar14 = (ulong)(uint)((int)cols * 4);
      lVar17 = (long)local_58 - uVar14;
      rows = uVar18 - cols;
      pfVar1 = rhs + rows;
      local_48 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 3);
      uVar20 = 0;
      pfVar19 = local_58;
      do {
        uVar23 = ~uVar20;
        lVar15 = uVar18 + uVar23;
        fVar26 = rhs[lVar15];
        if ((fVar26 != 0.0) || (NAN(fVar26))) {
          fVar26 = fVar26 / _lhs[lVar15 * lhsStride + lVar15];
          rhs[lVar15] = fVar26;
          uVar24 = uVar23 + cols;
          if (uVar24 != 0 && SCARRY8(uVar23,cols) == (long)uVar24 < 0) {
            unique0x10000471 = pfVar13;
            if (size <= lVar15) {
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                            ,0x7a,
                            "Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            if (((long)(uVar24 | rows) < 0) || ((long)(size - uVar24) < (long)rows)) {
              __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                            ,0x93,
                            "Eigen::Block<const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, -1, 1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, -1, 1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                           );
            }
            pfVar13 = _lhs + lVar15 * lhsStride + rows;
            uVar23 = uVar24;
            if (local_48 < uVar24) {
              uVar23 = local_48;
            }
            local_78._0_4_ = fVar26;
            if (((ulong)pfVar1 & 3) != 0) {
              uVar23 = uVar24;
            }
            uVar25 = uVar24 - uVar23;
            uVar16 = uVar25 + 3;
            if (-1 < (long)uVar25) {
              uVar16 = uVar25;
            }
            if (uVar23 != 0) {
              uVar21 = 0;
              do {
                *(float *)((long)pfVar22 + (uVar21 * 4 - uVar14)) =
                     *(float *)((long)pfVar22 + (uVar21 * 4 - uVar14)) -
                     *(float *)(lVar17 + uVar21 * 4) * fVar26;
                uVar21 = uVar21 + 1;
              } while (uVar23 != uVar21);
            }
            lVar15 = (uVar16 & 0xfffffffffffffffc) + uVar23;
            uVar21 = uVar23;
            if (3 < (long)uVar25) {
              do {
                pfVar2 = (float *)(lVar17 + uVar21 * 4);
                fVar7 = pfVar2[1];
                fVar8 = pfVar2[2];
                fVar9 = pfVar2[3];
                pfVar3 = (float *)((long)pfVar22 + (uVar21 * 4 - uVar14));
                fVar10 = pfVar3[1];
                fVar11 = pfVar3[2];
                fVar12 = pfVar3[3];
                pfVar4 = (float *)((long)pfVar22 + (uVar21 * 4 - uVar14));
                *pfVar4 = *pfVar3 - *pfVar2 * fVar26;
                pfVar4[1] = fVar10 - fVar7 * fVar26;
                pfVar4[2] = fVar11 - fVar8 * fVar26;
                pfVar4[3] = fVar12 - fVar9 * fVar26;
                uVar21 = uVar21 + 4;
              } while ((long)uVar21 < lVar15);
            }
            if (lVar15 < (long)uVar24) {
              lVar15 = uVar23 + local_50 + (uVar16 & 0xfffffffffffffffc);
              do {
                pfVar22[lVar15] = pfVar22[lVar15] - pfVar19[lVar15] * fVar26;
                lVar5 = uVar20 + lVar15;
                lVar15 = lVar15 + 1;
              } while (lVar5 != -2);
            }
          }
        }
        uStack_68 = (undefined4)((ulong)pfVar13 >> 0x20);
        uVar20 = uVar20 + 1;
        lVar17 = lVar17 + lhsStride * -4;
        pfVar19 = pfVar19 + -lhsStride;
      } while (uVar20 != cols);
      if (0 < (long)rows) {
        local_78._0_8_ = _lhs + rows * lhsStride;
        local_40.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
        local_40.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = pfVar1;
        local_78._8_8_ = lhsStride;
        general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
        ::run(rows,cols,(const_blas_data_mapper<float,_long,_0> *)local_78,&local_40,rhs,1,-1.0);
        pfVar13 = (float *)CONCAT44(uStack_68,local_78._12_4_);
      }
      local_58 = (float *)((long)local_58 + local_60);
      pfVar22 = pfVar22 + -8;
      bVar6 = 8 < (long)uVar18;
      uVar18 = uVar18 - 8;
    } while (bVar6);
  }
  return;
}

Assistant:

static void run(Index size, const LhsScalar* _lhs, Index lhsStride, RhsScalar* rhs)
  {
    typedef Map<const Matrix<LhsScalar,Dynamic,Dynamic,ColMajor>, 0, OuterStride<> > LhsMap;
    const LhsMap lhs(_lhs,size,size,OuterStride<>(lhsStride));
    typedef const_blas_data_mapper<LhsScalar,Index,ColMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    typename internal::conditional<Conjugate,
                                   const CwiseUnaryOp<typename internal::scalar_conjugate_op<LhsScalar>,LhsMap>,
                                   const LhsMap&
                                  >::type cjLhs(lhs);
    static const Index PanelWidth = EIGEN_TUNE_TRIANGULAR_PANEL_WIDTH;

    for(Index pi=IsLower ? 0 : size;
        IsLower ? pi<size : pi>0;
        IsLower ? pi+=PanelWidth : pi-=PanelWidth)
    {
      Index actualPanelWidth = (std::min)(IsLower ? size - pi : pi, PanelWidth);
      Index startBlock = IsLower ? pi : pi-actualPanelWidth;
      Index endBlock = IsLower ? pi + actualPanelWidth : 0;

      for(Index k=0; k<actualPanelWidth; ++k)
      {
        Index i = IsLower ? pi+k : pi-k-1;
        if(numext::not_equal_strict(rhs[i],RhsScalar(0)))
        {
          if(!(Mode & UnitDiag))
            rhs[i] /= cjLhs.coeff(i,i);

          Index r = actualPanelWidth - k - 1; // remaining size
          Index s = IsLower ? i+1 : i-r;
          if (r>0)
            Map<Matrix<RhsScalar,Dynamic,1> >(rhs+s,r) -= rhs[i] * cjLhs.col(i).segment(s,r);
        }
      }
      Index r = IsLower ? size - endBlock : startBlock; // remaining size
      if (r > 0)
      {
        // let's directly call the low level product function because:
        // 1 - it is faster to compile
        // 2 - it is slightly faster at runtime
        general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,Conjugate,RhsScalar,RhsMapper,false>::run(
            r, actualPanelWidth,
            LhsMapper(&lhs.coeffRef(endBlock,startBlock), lhsStride),
            RhsMapper(rhs+startBlock, 1),
            rhs+endBlock, 1, RhsScalar(-1));
      }
    }
  }